

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O2

bool __thiscall
UnifiedRegex::CharSetLeaf::GetNextRange
          (CharSetLeaf *this,uint level,Char searchCharStart,Char *outLowerChar,Char *outHigherChar)

{
  code *pcVar1;
  bool bVar2;
  Char CVar3;
  int k;
  int iVar4;
  undefined4 *puVar5;
  uint k_00;
  undefined6 in_register_00000012;
  uint uVar6;
  uint u;
  
  k_00 = (uint)CONCAT62(in_register_00000012,searchCharStart);
  uVar6 = -1 << ((char)level * '\x04' + 8U & 0x1f);
  if (-uVar6 <= k_00) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x341,"(searchCharStart < lim(level) + 1)",
                       "searchCharStart < lim(level) + 1");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  k = CharBitvec::NextSet(&this->vec,k_00);
  if (k != -1) {
    *outLowerChar = (Char)k;
    iVar4 = CharBitvec::NextClear(&this->vec,k);
    u = iVar4 - 1;
    if (iVar4 == -1) {
      u = ~uVar6;
    }
    CVar3 = Chars<char16_t>::UTC(u);
    *outHigherChar = CVar3;
  }
  return k != -1;
}

Assistant:

bool CharSetLeaf::GetNextRange(uint level, Char searchCharStart, _Out_ Char *outLowerChar, _Out_ Char *outHigherChar) const
    {
        Assert(searchCharStart < lim(level) + 1);
        int nextSet = vec.NextSet(searchCharStart);

        if (nextSet == -1)
        {
            return false;
        }

        *outLowerChar = (char16)nextSet;

        int nextClear = vec.NextClear(nextSet);

        *outHigherChar = UTC(nextClear == -1 ? lim(level) : nextClear - 1);

        return true;
    }